

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.h
# Opt level: O2

void __thiscall llvm::DWARFDebugNames::ValueIterator::setEnd(ValueIterator *this)

{
  ValueIterator local_128;
  
  memset(&local_128,0,0x100);
  local_128.Key.field_2._M_local_buf[0] = '\0';
  local_128.Hash.Storage.hasVal = false;
  local_128.Key._M_dataplus._M_p = (pointer)&local_128.Key.field_2;
  operator=(this,&local_128);
  ~ValueIterator(&local_128);
  return;
}

Assistant:

void setEnd() { *this = ValueIterator(); }